

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O0

bool __thiscall wasm::anon_unknown_236::Scanner::isRelevant(Scanner *this,Expression *curr)

{
  bool bVar1;
  Index IVar2;
  CostAnalyzer local_2c;
  uintptr_t local_28;
  Expression *local_20;
  Expression *curr_local;
  Scanner *this_local;
  
  local_20 = curr;
  curr_local = (Expression *)this;
  bVar1 = wasm::Type::isConcrete(&curr->type);
  if ((((bVar1) && (bVar1 = Expression::is<wasm::LocalGet>(local_20), !bVar1)) &&
      (bVar1 = Expression::is<wasm::LocalSet>(local_20), !bVar1)) &&
     (bVar1 = Properties::isConstantExpression(local_20), !bVar1)) {
    local_28 = (local_20->type).id;
    bVar1 = TypeUpdating::canHandleAsLocal((Type)local_28);
    if (bVar1) {
      if ((0 < this->options->shrinkLevel) && (IVar2 = Measurer::measure(local_20), 2 < IVar2)) {
        return true;
      }
      bVar1 = false;
      if (this->options->shrinkLevel == 0) {
        CostAnalyzer::CostAnalyzer(&local_2c,local_20);
        bVar1 = local_2c.cost != 0;
      }
      if (!bVar1) {
        return false;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool isRelevant(Expression* curr) {
    // * Ignore anything that is not a concrete type, as we are looking for
    //   computed values to reuse, and so none and unreachable are irrelevant.
    // * Ignore local.get and set, as those are the things we optimize to.
    // * Ignore constants so that we don't undo the effects of constant
    //   propagation.
    // * Ignore things we cannot put in a local, as then we can't do this
    //   optimization at all.
    //
    // More things matter here, like having side effects or not, but computing
    // them is not cheap, so leave them for later, after we know if there
    // actually are any requests for reuse of this value (which is rare).
    if (!curr->type.isConcrete() || curr->is<LocalGet>() ||
        curr->is<LocalSet>() || Properties::isConstantExpression(curr) ||
        !TypeUpdating::canHandleAsLocal(curr->type)) {
      return false;
    }

    // If the size is at least 3, then if we have two of them we have 6,
    // and so adding one set+one get and removing one of the items itself
    // is not detrimental, and may be beneficial.
    // TODO: investigate size 2
    if (options.shrinkLevel > 0 && Measurer::measure(curr) >= 3) {
      return true;
    }

    // If we focus on speed, any reduction in cost is beneficial, as the
    // cost of a get is essentially free.
    if (options.shrinkLevel == 0 && CostAnalyzer(curr).cost > 0) {
      return true;
    }

    return false;
  }